

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void rbuTmpInsertFunc(sqlite3_context *pCtx,int nVal,sqlite3_value **apVal)

{
  sqlite3_value **ppsVar1;
  void *pvVar2;
  int errCode;
  i64 iVar3;
  long lVar4;
  
  pvVar2 = pCtx->pFunc->pUserData;
  iVar3 = sqlite3VdbeIntValue(*apVal);
  if ((int)iVar3 != 0) {
    *(long *)((long)pvVar2 + 0x118) =
         *(long *)((long)pvVar2 + 0x118) + (long)*(int *)((long)pvVar2 + 0xc4);
  }
  lVar4 = 0;
  errCode = 0;
  while ((errCode == 0 && (lVar4 < nVal))) {
    ppsVar1 = apVal + lVar4;
    lVar4 = lVar4 + 1;
    errCode = sqlite3_bind_value(*(sqlite3_stmt **)((long)pvVar2 + 0xe8),(int)lVar4,*ppsVar1);
  }
  if (errCode == 0) {
    sqlite3_step(*(sqlite3_stmt **)((long)pvVar2 + 0xe8));
    errCode = sqlite3_reset(*(sqlite3_stmt **)((long)pvVar2 + 0xe8));
    if (errCode == 0) {
      return;
    }
  }
  sqlite3_result_error_code(pCtx,errCode);
  return;
}

Assistant:

static void rbuTmpInsertFunc(
  sqlite3_context *pCtx, 
  int nVal,
  sqlite3_value **apVal
){
  sqlite3rbu *p = sqlite3_user_data(pCtx);
  int rc = SQLITE_OK;
  int i;

  assert( sqlite3_value_int(apVal[0])!=0
      || p->objiter.eType==RBU_PK_EXTERNAL 
      || p->objiter.eType==RBU_PK_NONE 
  );
  if( sqlite3_value_int(apVal[0])!=0 ){
    p->nPhaseOneStep += p->objiter.nIndex;
  }

  for(i=0; rc==SQLITE_OK && i<nVal; i++){
    rc = sqlite3_bind_value(p->objiter.pTmpInsert, i+1, apVal[i]);
  }
  if( rc==SQLITE_OK ){
    sqlite3_step(p->objiter.pTmpInsert);
    rc = sqlite3_reset(p->objiter.pTmpInsert);
  }

  if( rc!=SQLITE_OK ){
    sqlite3_result_error_code(pCtx, rc);
  }
}